

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::PersistentColumnData>
          (Serializer *this,vector<duckdb::PersistentColumnData,_true> *vec)

{
  pointer pPVar1;
  PersistentColumnData *item;
  pointer value;
  
  (*this->_vptr_Serializer[8])
            (this,(long)(vec->
                        super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ).
                        super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ).
                        super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6);
  pPVar1 = (vec->
           super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           ).
           super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (value = (vec->
               super_vector<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               ).
               super__Vector_base<duckdb::PersistentColumnData,_std::allocator<duckdb::PersistentColumnData>_>
               ._M_impl.super__Vector_impl_data._M_start; value != pPVar1; value = value + 1) {
    WriteValue<duckdb::PersistentColumnData>(this,value);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const vector<T> &vec) {
		auto count = vec.size();
		OnListBegin(count);
		for (auto &item : vec) {
			WriteValue(item);
		}
		OnListEnd();
	}